

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirstWorkingReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::FirstWorkingReporter::report
          (FirstWorkingReporter *this,string *received,string *approved)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  shared_ptr<ApprovalTests::Reporter> *r;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  *__range1;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff57;
  string local_80 [32];
  string local_60 [32];
  reference local_40;
  shared_ptr<ApprovalTests::Reporter> *local_38;
  __normal_iterator<const_std::shared_ptr<ApprovalTests::Reporter>_*,_std::vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>_>
  local_30;
  long local_28;
  
  local_28 = in_RDI + 8;
  local_30._M_current =
       (shared_ptr<ApprovalTests::Reporter> *)
       ::std::
       vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_38 = (shared_ptr<ApprovalTests::Reporter> *)
             ::std::
             vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
             ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<ApprovalTests::Reporter>_*,_std::vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (__normal_iterator<const_std::shared_ptr<ApprovalTests::Reporter>_*,_std::vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      return false;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<ApprovalTests::Reporter>_*,_std::vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>_>
               ::operator*(&local_30);
    peVar3 = ::std::
             __shared_ptr_access<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1eaf31);
    ::std::__cxx11::string::string(local_60,in_RSI);
    ::std::__cxx11::string::string(local_80,in_RDX);
    iVar2 = (*peVar3->_vptr_Reporter[2])(peVar3,local_60,local_80);
    in_stack_ffffffffffffff57 = (byte)iVar2;
    ::std::__cxx11::string::~string(local_80);
    ::std::__cxx11::string::~string(local_60);
    if ((in_stack_ffffffffffffff57 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<ApprovalTests::Reporter>_*,_std::vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>_>
    ::operator++(&local_30);
  }
  return true;
}

Assistant:

bool FirstWorkingReporter::report(std::string received, std::string approved) const
    {
        for (auto& r : reporters)
        {
            if (r->report(received, approved))
            {
                return true;
            }
        }
        return false;
    }